

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

string * __thiscall
libtorrent::print_entry_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,bdecode_node *e,bool single_line,
          int indent)

{
  byte bVar1;
  type_t tVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  undefined7 in_register_00000009;
  string_view str_00;
  string_view str_01;
  char *local_320;
  char *local_318;
  byte local_305;
  char *local_300;
  char *local_2f8;
  byte local_2e5;
  string local_298;
  string *local_278;
  char *pcStack_270;
  undefined1 auStack_260 [8];
  pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> ent;
  int i_1;
  bool one_liner_1;
  string local_1c8;
  int local_1a8;
  byte local_1a1;
  int i;
  bool one_liner;
  size_t local_198;
  allocator<char> local_189;
  char local_188 [8];
  char str [100];
  allocator<char> local_109;
  string local_108 [8];
  string ret;
  char indent_str [200];
  int indent_local;
  bool single_line_local;
  bdecode_node *e_local;
  
  bVar1 = (byte)e & 1;
  iVar3 = (int)CONCAT71(in_register_00000009,single_line);
  memset((void *)((long)&ret.field_2 + 8),0x20,200);
  ret.field_2._M_local_buf[8] = ',';
  ret.field_2._M_local_buf[9] = '\n';
  if ((iVar3 < 0xc5) && (-1 < iVar3)) {
    indent_str[(long)(iVar3 + 2) + -8] = '\0';
  }
  std::__cxx11::string::string(local_108);
  tVar2 = bdecode_node::type((bdecode_node *)this);
  switch(tVar2) {
  case none_t:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"none",&local_109);
    std::allocator<char>::~allocator(&local_109);
    break;
  case dict_t:
    std::__cxx11::string::operator+=(local_108,'{');
    iVar3 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    local_305 = 1;
    if (iVar3 == -1) {
      local_305 = bVar1;
    }
    ent.second._63_1_ = local_305;
    if (local_305 == 0) {
      std::__cxx11::string::operator+=(local_108,ret.field_2._M_local_buf + 9);
    }
    for (ent.second.m_size = 0; iVar3 = ent.second.m_size,
        iVar4 = bdecode_node::dict_size((bdecode_node *)this), iVar3 < iVar4;
        ent.second.m_size = ent.second.m_size + 1) {
      if ((ent.second.m_size == 0) && ((ent.second._63_1_ & 1) != 0)) {
        std::__cxx11::string::operator+=(local_108,' ');
      }
      bdecode_node::dict_at
                ((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
                  *)auStack_260,(bdecode_node *)this,ent.second.m_size);
      local_278 = (string *)auStack_260;
      pcStack_270 = ent.first.ptr_;
      str_01.len_ = 1;
      str_01.ptr_ = ent.first.ptr_;
      anon_unknown_10::print_string
                ((anon_unknown_10 *)local_108,(string *)auStack_260,str_01,SUB41(indent,0));
      std::__cxx11::string::operator+=(local_108,": ");
      print_entry_abi_cxx11_
                (&local_298,(libtorrent *)&ent.first.len_,(bdecode_node *)(ulong)bVar1,
                 (bool)(single_line + '\x02'),indent);
      std::__cxx11::string::operator+=(local_108,(string *)&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      iVar3 = ent.second.m_size;
      iVar4 = bdecode_node::dict_size((bdecode_node *)this);
      if (iVar3 < iVar4 + -1) {
        if ((ent.second._63_1_ & 1) == 0) {
          local_318 = ret.field_2._M_local_buf + 8;
        }
        else {
          local_318 = ", ";
        }
        std::__cxx11::string::operator+=(local_108,local_318);
      }
      else {
        if ((ent.second._63_1_ & 1) == 0) {
          local_320 = ret.field_2._M_local_buf + 9;
        }
        else {
          local_320 = " ";
        }
        std::__cxx11::string::operator+=(local_108,local_320);
      }
      std::pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>::
      ~pair((pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
             *)auStack_260);
    }
    std::__cxx11::string::operator+=(local_108,'}');
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_108);
    break;
  case list_t:
    std::__cxx11::string::operator+=(local_108,'[');
    iVar3 = anon_unknown_10::line_longer_than((bdecode_node *)this,200);
    local_2e5 = 1;
    if (iVar3 == -1) {
      local_2e5 = bVar1;
    }
    local_1a1 = local_2e5;
    if (local_2e5 == 0) {
      std::__cxx11::string::operator+=(local_108,ret.field_2._M_local_buf + 9);
    }
    for (local_1a8 = 0; iVar3 = local_1a8, iVar4 = bdecode_node::list_size((bdecode_node *)this),
        iVar3 < iVar4; local_1a8 = local_1a8 + 1) {
      if ((local_1a8 == 0) && ((local_1a1 & 1) != 0)) {
        std::__cxx11::string::operator+=(local_108,' ');
      }
      bdecode_node::list_at((bdecode_node *)&i_1,(bdecode_node *)this,local_1a8);
      print_entry_abi_cxx11_
                (&local_1c8,(libtorrent *)&i_1,(bdecode_node *)(ulong)bVar1,
                 (bool)(single_line + '\x02'),indent);
      std::__cxx11::string::operator+=(local_108,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      bdecode_node::~bdecode_node((bdecode_node *)&i_1);
      iVar3 = local_1a8;
      iVar4 = bdecode_node::list_size((bdecode_node *)this);
      if (iVar3 < iVar4 + -1) {
        if ((local_1a1 & 1) == 0) {
          local_2f8 = ret.field_2._M_local_buf + 8;
        }
        else {
          local_2f8 = ", ";
        }
        std::__cxx11::string::operator+=(local_108,local_2f8);
      }
      else {
        if ((local_1a1 & 1) == 0) {
          local_300 = ret.field_2._M_local_buf + 9;
        }
        else {
          local_300 = " ";
        }
        std::__cxx11::string::operator+=(local_108,local_300);
      }
    }
    std::__cxx11::string::operator+=(local_108,']');
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_108);
    break;
  case string_t:
    _i = bdecode_node::string_value((bdecode_node *)this);
    str_00.ptr_ = i._8_8_;
    str_00.len_._0_1_ = bVar1;
    str_00.len_._1_7_ = 0;
    anon_unknown_10::print_string
              ((anon_unknown_10 *)local_108,(string *)(char *)i,str_00,SUB41(indent,0));
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_108);
    break;
  case int_t:
    iVar5 = bdecode_node::int_value((bdecode_node *)this);
    snprintf(local_188,100,"%ld",iVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_188,&local_189);
    std::allocator<char>::~allocator(&local_189);
    break;
  default:
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_108);
  }
  str[0x60] = '\x01';
  str[0x61] = '\0';
  str[0x62] = '\0';
  str[99] = '\0';
  std::__cxx11::string::~string(local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string print_entry(bdecode_node const& e
		, bool single_line, int indent)
	{
		char indent_str[200];
		using std::memset;
		memset(indent_str, ' ', 200);
		indent_str[0] = ',';
		indent_str[1] = '\n';
		indent_str[199] = 0;
		if (indent < 197 && indent >= 0) indent_str[indent + 2] = 0;
		std::string ret;
		switch (e.type())
		{
			case bdecode_node::none_t: return "none";
			case bdecode_node::int_t:
			{
				char str[100];
				std::snprintf(str, sizeof(str), "%" PRId64, e.int_value());
				return str;
			}
			case bdecode_node::string_t:
			{
				print_string(ret, e.string_value(), single_line);
				return ret;
			}
			case bdecode_node::list_t:
			{
				ret += '[';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.list_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					ret += print_entry(e.list_at(i), single_line, indent + 2);
					if (i < e.list_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += ']';
				return ret;
			}
			case bdecode_node::dict_t:
			{
				ret += '{';
				bool one_liner = line_longer_than(e, 200) != -1 || single_line;

				if (!one_liner) ret += indent_str + 1;
				for (int i = 0; i < e.dict_size(); ++i)
				{
					if (i == 0 && one_liner) ret += ' ';
					std::pair<string_view, bdecode_node> ent = e.dict_at(i);
					print_string(ret, ent.first, true);
					ret += ": ";
					ret += print_entry(ent.second, single_line, indent + 2);
					if (i < e.dict_size() - 1) ret += (one_liner ? ", " : indent_str);
					else ret += (one_liner ? " " : indent_str + 1);
				}
				ret += '}';
				return ret;
			}
		}
		return ret;
	}